

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,Privkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *pCVar2;
  uint32_t uVar3;
  int ret;
  allocator local_27d;
  uint32_t local_27c;
  string local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_258;
  Privkey *local_250;
  ByteData256 *local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  Pubkey pubkey;
  ext_key local_1b0;
  undefined1 local_f0 [52];
  uint8_t local_bc;
  uchar local_b1;
  undefined1 local_b0 [36];
  undefined1 local_8c [20];
  uint32_t local_78;
  undefined1 local_71 [65];
  
  local_27c = child_num;
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  local_248 = &this->chaincode_;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(local_248);
  local_250 = &this->privkey_;
  Privkey::Privkey(local_250);
  local_258 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->tweak_sum_;
  ByteData256::ByteData256((ByteData256 *)local_258);
  bVar1 = Privkey::IsValid(parent_key);
  if (!bVar1) {
    local_f0._0_8_ = "cfdcore_hdwallet.cpp";
    local_f0._8_4_ = 0x1e8;
    local_f0._16_8_ = (long)"kCfdExtPrivkey" + 4;
    logger::warn<>((CfdSourceLocation *)local_f0,"invalid privkey.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_f0,"Failed to privkey. ExtPrivkey invalid privkey.",
               (allocator *)&local_1b0);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar3 = 0x4358394;
  if (network_type == kMainnet) {
    uVar3 = 0x488ade4;
  }
  if (network_type == kLiquidV1) {
    uVar3 = 0x488ade4;
  }
  memset(local_f0,0,0xc0);
  local_bc = parent_depth;
  local_78 = uVar3;
  Privkey::GeneratePubkey(&pubkey,parent_key,true);
  Privkey::GetData((ByteData *)&local_1b0,parent_key);
  ByteData::GetBytes(&privkey_bytes,(ByteData *)&local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  Pubkey::GetData((ByteData *)&local_1b0,&pubkey);
  ByteData::GetBytes(&pubkey_bytes,(ByteData *)&local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  HashUtil::Hash160((ByteData160 *)&local_1b0,&pubkey);
  ByteData160::GetBytes(&pubkey_hash,(ByteData160 *)&local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  ByteData256::GetData((ByteData *)&local_1b0,parent_chain_code);
  ByteData::GetBytes(&chain_bytes,(ByteData *)&local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  local_b1 = '\0';
  memcpy(local_b0,privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_71,pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_8c,pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memcpy((ext_key *)local_f0,
         chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memset(&local_1b0,0,0xc0);
  ret = bip32_key_from_parent((ext_key *)local_f0,local_27c,0,&local_1b0);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,0x4e,
               (allocator_type *)&local_278);
    ret = bip32_key_serialize(&local_1b0,0,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (ret == 0) {
      ByteData::ByteData((ByteData *)&local_278,&data);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_278);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
      ByteData256::ByteData256((ByteData256 *)&local_278);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_258);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
      AnalyzeBip32KeyData(&local_1b0,(string *)0x0,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                          &this->version_,&this->depth_,&this->child_num_,local_248,local_250,
                          (Pubkey *)0x0,&this->fingerprint_);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
      return;
    }
    local_278._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_278._M_string_length._0_4_ = 0x210;
    local_278.field_2._M_allocated_capacity = (long)"kCfdExtPrivkey" + 4;
    logger::warn<int&>((CfdSourceLocation *)&local_278,"bip32_key_serialize error. ret={}",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&local_278,"ExtPrivkey serialize error.",&local_27d);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_278);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_278._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_278._M_string_length._0_4_ = 0x207;
  local_278.field_2._M_allocated_capacity = (long)"kCfdExtPrivkey" + 4;
  logger::warn<int&>((CfdSourceLocation *)&local_278,"bip32_key_from_parent error. ret={}",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_278,"ExtPubkey generatekey error.",(allocator *)&data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_278);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const Privkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }

  // create simple parent data
  struct ext_key parent = {};
  memset(&parent, 0, sizeof(parent));
  parent.version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    parent.version = kVersionMainnetPrivkey;
  }
  parent.depth = parent_depth;
  Pubkey pubkey = parent_key.GeneratePubkey(true);
  std::vector<uint8_t> privkey_bytes = parent_key.GetData().GetBytes();
  std::vector<uint8_t> pubkey_bytes = pubkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(pubkey).GetBytes();
  std::vector<uint8_t> chain_bytes = parent_chain_code.GetData().GetBytes();
  parent.priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
  memcpy(&parent.priv_key[1], privkey_bytes.data(), privkey_bytes.size());
  memcpy(parent.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  memcpy(parent.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(parent.chain_code, chain_bytes.data(), chain_bytes.size());

  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  int ret = bip32_key_from_parent(
      &parent, child_num, BIP32_FLAG_KEY_PRIVATE, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey generatekey error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}